

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

char * filemgr_redirect_old_file
                 (filemgr *very_old_file,filemgr *new_file,
                 filemgr_redirect_hdr_func *redirect_header_func)

{
  filemgr_header_revnum_t *pfVar1;
  filemgr *pfVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (new_file == (filemgr *)0x0 || very_old_file == (filemgr *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pthread_spin_lock(&very_old_file->lock);
    pfVar2 = filemgr_get_instance(very_old_file->new_filename);
    uVar8 = (ulong)(very_old_file->header).size;
    if (pfVar2 == (filemgr *)0x0 || uVar8 == 0) {
      pcVar6 = (char *)0x0;
    }
    else {
      sVar3 = strlen(new_file->filename);
      sVar4 = strlen(pfVar2->filename);
      uVar7 = (sVar3 & 0xffff) + (uVar8 - sVar4);
      if (uVar8 < uVar7) {
        pvVar5 = realloc((very_old_file->header).data,(ulong)new_file->blocksize);
        (very_old_file->header).data = pvVar5;
      }
      assign_new_filename(very_old_file,new_file->filename);
      pcVar6 = (*redirect_header_func)
                         (very_old_file,(uint8_t *)(very_old_file->header).data,new_file);
      (very_old_file->header).size = (filemgr_header_len_t)uVar7;
      pfVar1 = &(very_old_file->header).revnum;
      *pfVar1 = *pfVar1 + 1;
    }
    pthread_spin_unlock(&very_old_file->lock);
  }
  return pcVar6;
}

Assistant:

char *filemgr_redirect_old_file(struct filemgr *very_old_file,
                                struct filemgr *new_file,
                                filemgr_redirect_hdr_func
                                redirect_header_func) {
    if (!very_old_file || !new_file) {
        return NULL;
    }

    size_t old_header_len, new_header_len;
    uint16_t new_filename_len;
    char *past_filename;
    spin_lock(&very_old_file->lock);

    struct filemgr *new_file_of_very_old_file =
        filemgr_get_instance(very_old_file->new_filename);

    if (very_old_file->header.size == 0 || !new_file_of_very_old_file) {
        spin_unlock(&very_old_file->lock);
        return NULL;
    }

    old_header_len = very_old_file->header.size;
    new_filename_len = strlen(new_file->filename);
    // Find out the new DB header length with new_file's filename
    new_header_len = old_header_len
                     - strlen(new_file_of_very_old_file->filename)
                     + new_filename_len;
    // As we are going to change the new_filename field in the DB header of the
    // very_old_file, maybe reallocate DB header buf to accomodate bigger value
    if (new_header_len > old_header_len) {
        very_old_file->header.data = realloc(very_old_file->header.data,
                                             new_file->blocksize);
    }
    // Re-direct very_old_file to new_file
    assign_new_filename(very_old_file, new_file->filename);
    // Note that the old_filename of the new_file is not updated, this
    // is so that every file in the history is reachable from the current file.

    past_filename = redirect_header_func(very_old_file,
                                         (uint8_t *)very_old_file->header.data,
                                         new_file);//Update in-memory header
    very_old_file->header.size = new_header_len;
    ++(very_old_file->header.revnum);

    spin_unlock(&very_old_file->lock);
    return past_filename;
}